

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void TestIterator(void)

{
  _Elt_pointer pCVar1;
  int iVar2;
  _Elt_pointer pCVar3;
  _Map_pointer ppCVar4;
  _Elt_pointer pCVar5;
  _Elt_pointer pCVar6;
  undefined1 local_130 [16];
  begin local_120;
  _Map_pointer local_108;
  lazy_ostream local_100;
  _Elt_pointer local_f0;
  lazy_ostream *local_e8;
  _Map_pointer local_e0;
  assertion_result local_d8;
  InputBuffer ib;
  size_t toWrite;
  OutputBuffer ob;
  undefined1 local_98 [8];
  undefined1 local_90 [16];
  undefined8 *local_80;
  char *local_78;
  const_string local_70;
  _Elt_pointer local_60;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  Chunk *local_48;
  const_string local_40;
  
  local_120.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_120.m_file_name.m_end = "";
  local_120.m_line_num = 0x253;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_90[0] = 1;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dda78;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)0x1b467a;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)local_90);
  avro::OutputBuffer::OutputBuffer(&ob,0x800a);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x256;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_e0 = (_Map_pointer)&PTR__lazy_ostream_001dd7b8;
  local_90._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  ppCVar4 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_130._0_4_ =
       (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)((ob.pimpl_.px)->writeChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
       (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)((ob.pimpl_.px)->writeChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249 +
       ((int)((ulong)((long)ppCVar4 -
                     (long)((ob.pimpl_.px)->writeChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
       (uint)(ppCVar4 == (_Map_pointer)0x0)) * 9;
  ib.pimpl_.px = (element_type *)local_130;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_130._0_4_ == 3);
  toWrite = CONCAT44(toWrite._4_4_,3);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_e8 = (lazy_ostream *)&ib;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_58 = (_Elt_pointer)&PTR__lazy_ostream_001dd878;
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_130._8_8_ = &toWrite;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x256,CHECK,CHECK_EQUAL,2,"ob.numChunks()"
             ,&local_100,"3",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 599;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = (ob.pimpl_.px)->size_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x0);
  toWrite = toWrite & 0xffffffff00000000;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd838;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  local_130._8_8_ = &toWrite;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,599,CHECK,CHECK_EQUAL,2,"ob.size()",
             &local_100,"0U",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 600;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = (ob.pimpl_.px)->freeSpace_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x9000);
  toWrite = 0x9000;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  local_130._8_8_ = &toWrite;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,600,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",
             &local_100,"2 * kMaxBlockSize + kMinBlockSize",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x25a;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  pCVar3 = ((ob.pimpl_.px)->writeChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pCVar1 = ((ob.pimpl_.px)->writeChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar3 == pCVar1) {
    local_130._0_8_ = (Chunk *)0x0;
  }
  else {
    pCVar5 = ((ob.pimpl_.px)->writeChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppCVar4 = ((ob.pimpl_.px)->writeChunks_).
              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_130._0_8_ = (Chunk *)0x0;
    do {
      pCVar3 = pCVar3 + 1;
      if (pCVar3 == pCVar5) {
        pCVar3 = ppCVar4[1];
        ppCVar4 = ppCVar4 + 1;
        pCVar5 = pCVar3 + 9;
      }
      local_130._0_8_ = (long)&(((Chunk *)local_130._0_8_)->callOnDestroy_).px + 1;
    } while (pCVar3 != pCVar1);
  }
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x3);
  toWrite = CONCAT44(toWrite._4_4_,3);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_50 = (_Elt_pointer)&PTR__lazy_ostream_001dd9b8;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd9b8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)local_58;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  local_130._8_8_ = &toWrite;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x25a,CHECK,CHECK_EQUAL,2,
             "std::distance(ob.begin(), ob.end())",&local_100,"3",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  pCVar3 = ((ob.pimpl_.px)->writeChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_60 = ((ob.pimpl_.px)->writeChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  ppCVar4 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x25d;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = pCVar3->endPos_ + -(long)pCVar3->writePos_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x4000);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_130._8_8_ = &avro::detail::kMaxBlockSize;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x25d,CHECK,CHECK_EQUAL,2,"iter->size()",
             &local_100,"kMaxBlockSize",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  pCVar3 = pCVar3 + 1;
  if (pCVar3 == local_60) {
    pCVar3 = ppCVar4[1];
    ppCVar4 = ppCVar4 + 1;
    local_60 = pCVar3 + 9;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x25f;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = pCVar3->endPos_ + -(long)pCVar3->writePos_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x4000);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_130._8_8_ = &avro::detail::kMaxBlockSize;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x25f,CHECK,CHECK_EQUAL,2,"iter->size()",
             &local_100,"kMaxBlockSize",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  pCVar3 = pCVar3 + 1;
  if (pCVar3 == local_60) {
    pCVar3 = ppCVar4[1];
    ppCVar4 = ppCVar4 + 1;
    local_60 = pCVar3 + 9;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x261;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = pCVar3->endPos_ + -(long)pCVar3->writePos_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x1000);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_130._8_8_ = &avro::detail::kMinBlockSize;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x261,CHECK,CHECK_EQUAL,2,"iter->size()",
             &local_100,"kMinBlockSize",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  pCVar3 = pCVar3 + 1;
  if (pCVar3 == local_60) {
    pCVar3 = ppCVar4[1];
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x263;
  local_120.m_file_name.m_begin =
       (iterator)
       CONCAT71(local_120.m_file_name.m_begin._1_7_,
                pCVar3 == ((ob.pimpl_.px)->writeChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  local_120.m_file_name.m_end = (iterator)0x0;
  local_120.m_line_num = 0;
  local_90._0_8_ = "iter == ob.end()";
  local_90._8_8_ = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ddaf8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_end = "";
  local_e8 = (lazy_ostream *)local_90;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_120,&local_100,&local_40,0x263,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_120.m_line_num);
  toWrite = 0x5000;
  avro::OutputBuffer::wroteTo(&ob,0x5000);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x267;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = (ob.pimpl_.px)->size_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_130._0_8_ == toWrite);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_130._8_8_ = &toWrite;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x267,CHECK,CHECK_EQUAL,2,"ob.size()",
             &local_100,"toWrite",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x268;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_130._0_8_ = (ob.pimpl_.px)->freeSpace_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((Chunk *)local_130._0_8_ == (Chunk *)0x4000);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_130._8_8_ = &avro::detail::kMaxBlockSize;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x268,CHECK,CHECK_EQUAL,2,"ob.freeSpace()"
             ,&local_100,"kMaxBlockSize",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x269;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  ppCVar4 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar2 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar4 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar4 == (_Map_pointer)0x0)) * 9;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 2);
  local_98._0_4_ = 2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)local_58;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)local_58;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  local_130._8_8_ = (Chunk *)local_98;
  local_130._0_4_ = iVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x269,CHECK,CHECK_EQUAL,2,"ob.numChunks()"
             ,&local_100,"2",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x26a;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  ppCVar4 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_130._0_4_ =
       (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)((ob.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
       (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)((ob.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249 +
       ((int)((ulong)((long)ppCVar4 -
                     (long)((ob.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
       (uint)(ppCVar4 == (_Map_pointer)0x0)) * 9;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_130._0_4_ == 2);
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)local_58;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)&ib;
  local_98._0_4_ = 2;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  ib.pimpl_.px = (element_type *)local_130;
  local_120.m_file_name.m_begin = (iterator)local_58;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)(local_130 + 8);
  local_130._8_8_ = (Chunk *)local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x26a,CHECK,CHECK_EQUAL,2,
             "ob.numDataChunks()",&local_100,"2",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  avro::InputBuffer::InputBuffer(&ib,&ob);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x26d;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  pCVar3 = ((ib.pimpl_.px)->readChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pCVar1 = ((ib.pimpl_.px)->readChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar3 == pCVar1) {
    local_98 = (undefined1  [8])0x0;
  }
  else {
    pCVar5 = ((ib.pimpl_.px)->readChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppCVar4 = ((ib.pimpl_.px)->readChunks_).
              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_98 = (undefined1  [8])0x0;
    do {
      pCVar3 = pCVar3 + 1;
      if (pCVar3 == pCVar5) {
        pCVar3 = ppCVar4[1];
        ppCVar4 = ppCVar4 + 1;
        pCVar5 = pCVar3 + 9;
      }
      local_98 = (undefined1  [8])((long)&(((Chunk *)local_98)->callOnDestroy_).px + 1);
    } while (pCVar3 != pCVar1);
  }
  local_48 = (Chunk *)CONCAT44(local_48._4_4_,2);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_98 == (undefined1  [8])0x2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)local_50;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)(local_130 + 8);
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)local_58;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)local_130;
  local_130._0_8_ = (Chunk *)&local_48;
  local_130._8_8_ = (Chunk *)local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x26d,CHECK,CHECK_EQUAL,2,
             "std::distance(ib.begin(), ib.end())",&local_100,"2",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  pCVar3 = ((ob.pimpl_.px)->writeChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pCVar1 = ((ob.pimpl_.px)->writeChunks_).
           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar3 == pCVar1) {
    local_98 = (undefined1  [8])0x0;
  }
  else {
    pCVar5 = ((ob.pimpl_.px)->writeChunks_).
             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppCVar4 = ((ob.pimpl_.px)->writeChunks_).
              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_98 = (undefined1  [8])0x0;
    do {
      pCVar6 = pCVar3 + 1;
      if (pCVar6 == pCVar5) {
        pCVar6 = ppCVar4[1];
        ppCVar4 = ppCVar4 + 1;
        pCVar5 = pCVar6 + 9;
      }
      local_98 = (undefined1  [8])
                 ((long)local_98 + ((long)pCVar3->endPos_ - (long)pCVar3->writePos_));
      pCVar3 = pCVar6;
    } while (pCVar6 != pCVar1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x275;
  local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
  local_90._0_8_ = local_e0;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_48 = (Chunk *)(ob.pimpl_.px)->freeSpace_;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1  [8])local_48 == local_98);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_70.m_end = "";
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_f0 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_e8 = (lazy_ostream *)(local_130 + 8);
  local_120.m_file_name.m_end = (iterator)((ulong)local_120.m_file_name.m_end & 0xffffffffffffff00);
  local_120.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_120.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_108 = (_Map_pointer)local_130;
  local_130._0_8_ = (Chunk *)local_98;
  local_130._8_8_ = (Chunk *)&local_48;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_90,&local_70,0x275,CHECK,CHECK_EQUAL,2,"ob.freeSpace()"
             ,&local_100,"acc",&local_120);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  avro::OutputBuffer::wroteTo
            (&ob,(size_type)((long)&((shared_ptr<avro::detail::CallOnDestroy> *)local_98)->px + 1));
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestIterator() 
{
    BOOST_TEST_MESSAGE( "TestIterator");
    {
        OutputBuffer ob(2 * kMaxBlockSize + 10);
        BOOST_CHECK_EQUAL(ob.numChunks(), 3);
        BOOST_CHECK_EQUAL(ob.size(), 0U);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 2 * kMaxBlockSize + kMinBlockSize);

        BOOST_CHECK_EQUAL (std::distance(ob.begin(), ob.end()), 3);

        OutputBuffer::const_iterator iter = ob.begin();
        BOOST_CHECK_EQUAL( iter->size(), kMaxBlockSize);
        ++iter;
        BOOST_CHECK_EQUAL( iter->size(), kMaxBlockSize);
        ++iter;
        BOOST_CHECK_EQUAL( iter->size(), kMinBlockSize);
        ++iter;
        BOOST_CHECK( iter == ob.end());

        size_t toWrite = kMaxBlockSize + kMinBlockSize;
        ob.wroteTo(toWrite);
        BOOST_CHECK_EQUAL(ob.size(), toWrite);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kMaxBlockSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        InputBuffer ib = ob;
        BOOST_CHECK_EQUAL (std::distance(ib.begin(), ib.end()), 2);

        size_t acc = 0;
        for(OutputBuffer::const_iterator iter = ob.begin();
            iter != ob.end(); 
            ++iter) {
            acc += iter->size();
        }
        BOOST_CHECK_EQUAL(ob.freeSpace(), acc);

        try {
            ob.wroteTo(acc+1);
        }
        catch (std::exception &e) {
            std::cout << "Intentionally triggered exception: " << e.what() << std::endl; 
        }
    }
}